

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathCompLocationPath(xmlXPathParserContextPtr ctxt)

{
  bool bVar1;
  xmlXPathParserContextPtr ctxt_local;
  
  while( true ) {
    bVar1 = true;
    if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar1 = true, 10 < *ctxt->cur)))) {
      bVar1 = *ctxt->cur == '\r';
    }
    if (!bVar1) break;
    if (*ctxt->cur != '\0') {
      ctxt->cur = ctxt->cur + 1;
    }
  }
  if (*ctxt->cur == '/') {
    do {
      if (*ctxt->cur != '/') {
        return;
      }
      if ((*ctxt->cur == '/') && (ctxt->cur[1] == '/')) {
        ctxt->cur = ctxt->cur + 2;
        while( true ) {
          bVar1 = true;
          if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar1 = true, 10 < *ctxt->cur)))) {
            bVar1 = *ctxt->cur == '\r';
          }
          if (!bVar1) break;
          if (*ctxt->cur != '\0') {
            ctxt->cur = ctxt->cur + 1;
          }
        }
        xmlXPathCompExprAdd(ctxt,ctxt->comp->last,-1,XPATH_OP_COLLECT,6,1,0,(void *)0x0,(void *)0x0)
        ;
        xmlXPathCompRelativeLocationPath(ctxt);
      }
      else if (*ctxt->cur == '/') {
        if (*ctxt->cur != '\0') {
          ctxt->cur = ctxt->cur + 1;
        }
        while( true ) {
          bVar1 = true;
          if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar1 = true, 10 < *ctxt->cur)))) {
            bVar1 = *ctxt->cur == '\r';
          }
          if (!bVar1) break;
          if (*ctxt->cur != '\0') {
            ctxt->cur = ctxt->cur + 1;
          }
        }
        if ((*ctxt->cur != '\0') &&
           (((((0x40 < *ctxt->cur && (*ctxt->cur < 0x5b)) ||
              ((0x60 < *ctxt->cur && (*ctxt->cur < 0x7b)))) ||
             (((*ctxt->cur == '_' || (*ctxt->cur == '.')) || (*ctxt->cur == '@')))) ||
            (*ctxt->cur == '*')))) {
          xmlXPathCompRelativeLocationPath(ctxt);
        }
      }
    } while (ctxt->error == 0);
  }
  else {
    xmlXPathCompRelativeLocationPath(ctxt);
  }
  return;
}

Assistant:

static void
xmlXPathCompLocationPath(xmlXPathParserContextPtr ctxt) {
    SKIP_BLANKS;
    if (CUR != '/') {
        xmlXPathCompRelativeLocationPath(ctxt);
    } else {
	while (CUR == '/') {
	    if ((CUR == '/') && (NXT(1) == '/')) {
		SKIP(2);
		SKIP_BLANKS;
		PUSH_LONG_EXPR(XPATH_OP_COLLECT, AXIS_DESCENDANT_OR_SELF,
			     NODE_TEST_TYPE, NODE_TYPE_NODE, NULL, NULL);
		xmlXPathCompRelativeLocationPath(ctxt);
	    } else if (CUR == '/') {
		NEXT;
		SKIP_BLANKS;
		if ((CUR != 0 ) &&
		    ((IS_ASCII_LETTER(CUR)) || (CUR == '_') || (CUR == '.') ||
		     (CUR == '@') || (CUR == '*')))
		    xmlXPathCompRelativeLocationPath(ctxt);
	    }
	    CHECK_ERROR;
	}
    }
}